

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  string *psVar1;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  long lVar4;
  MutexLock l;
  MutexLock local_40;
  MutexLock local_38;
  
  local_40.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) {
LAB_00115405:
      abort();
    }
  }
  lVar4 = 0;
  do {
    this = (LogDestination *)(&log_destinations_)[lVar4];
    if (this == (LogDestination *)0x0) {
      this = (LogDestination *)operator_new(0xe0);
      LogDestination(this,(LogSeverity)lVar4,(char *)0x0);
      (&log_destinations_)[lVar4] = this;
    }
    local_38.mu_ = &(this->fileobject_).lock_;
    if ((this->fileobject_).lock_.is_safe_ == true) {
      iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_38.mu_);
      if (iVar3 != 0) goto LAB_00115405;
    }
    psVar1 = &(this->fileobject_).filename_extension_;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 != 0) {
      __stream = (FILE *)(this->fileobject_).file_;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        (this->fileobject_).file_ = (FILE *)0x0;
        (this->fileobject_).rollover_attempt_ = 0x1f;
      }
      pcVar2 = (char *)(this->fileobject_).filename_extension_._M_string_length;
      strlen(ext);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)ext);
    }
    ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
      return;
    }
  } while( true );
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for ( int severity = 0; severity < NUM_SEVERITIES; ++severity ) {
    log_destination(severity)->fileobject_.SetExtension(ext);
  }
}